

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O3

void __thiscall
pbrt::BinaryWriter::write<std::pair<float,float>,std::allocator<std::pair<float,float>>,void,void>
          (BinaryWriter *this,
          vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *t)

{
  pointer ppVar1;
  pointer ppVar2;
  long lVar3;
  long lVar4;
  long local_30;
  
  ppVar1 = (t->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  ppVar2 = (t->
           super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)ppVar1 - (long)ppVar2 >> 3;
  local_30 = lVar4;
  writeRaw(this,&local_30,8);
  if (ppVar1 != ppVar2) {
    lVar4 = lVar4 + (ulong)(lVar4 == 0);
    lVar3 = 0;
    do {
      writeRaw(this,(void *)((long)&((t->
                                     super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->first + lVar3),8);
      lVar3 = lVar3 + 8;
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }